

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<VarCounter>>::
ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<VarCounter>>::VarHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<VarCounter>>
           *this,int info)

{
  int num_items;
  int num_values;
  IntSuffixHandler suffix_handler;
  DblSuffixHandler suffix_handler_1;
  IntSuffixHandler local_22;
  DblSuffixHandler local_21;
  
  num_items = **(int **)(this + 8);
  num_values = NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<VarCounter>_>
               ::ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<VarCounter>_>
                           *)this,1,num_items + 1);
  TextReader<fmt::Locale>::ReadName(*(TextReader<fmt::Locale> **)this);
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  if ((info & 4U) == 0) {
    ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<VarCounter>>::IntReader,mp::NLHandler<mp::NullNLHandler<int>,int>::IntSuffixHandler>
              (this,num_values,num_items,&local_22);
  }
  else {
    ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<VarCounter>>::DoubleReader,mp::NLHandler<mp::NullNLHandler<int>,int>::DblSuffixHandler>
              (this,num_values,num_items,&local_21);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadSuffix(int info) {
  int num_items = ItemInfo(*this).num_items();
  int num_values = ReadUInt(1, num_items + 1);
  fmt::StringRef name = reader_.ReadName();
  reader_.ReadTillEndOfLine();
  suf::Kind kind = static_cast<suf::Kind>(info & internal::SUFFIX_KIND_MASK);
  if ((info & suf::FLOAT) != 0) {
    typename Handler::DblSuffixHandler
        suffix_handler = handler_.OnDblSuffix(name, kind, num_values);
    ReadSuffixValues<DoubleReader>(num_values, num_items, suffix_handler);
  } else {
    typename Handler::IntSuffixHandler
        suffix_handler = handler_.OnIntSuffix(name, kind, num_values);
    ReadSuffixValues<IntReader>(num_values, num_items, suffix_handler);
  }
}